

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O1

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
improvePath(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            *this)

{
  double *pdVar1;
  int *piVar2;
  int iVar3;
  iterator __position;
  pointer pHVar4;
  bool bVar5;
  ostream *poVar6;
  long lVar7;
  mapped_type *pmVar8;
  long lVar9;
  double dVar10;
  element_type *peVar11;
  SearchVertexPtr least_cost_vertex;
  undefined1 local_a1;
  Heap<double> local_a0;
  element_type *local_88;
  uint local_7c;
  Heap<double> *local_78;
  Heap<double> local_70;
  _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_58;
  Heap<double> local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_a0.data_.
  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_a0.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  __position._M_current =
       (this->anytime_stats_).num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->anytime_stats_).num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(this->anytime_stats_).num_expansions_,__position,(int *)&local_a0);
  }
  else {
    *__position._M_current = 0;
    (this->anytime_stats_).num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[AMHAStar::improvePath] Improve path iteration: ",0x30);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  local_78 = &(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).open_;
  local_58 = (_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&(this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).closed_;
  local_70.data_.
  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->closed_inad_;
  do {
    csbpl_common::Heap<double>::top(&local_a0);
    peVar11 = ((local_a0.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a0.data_.
        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_a0.data_.
      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)peVar11;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a0.data_.
                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      peVar11 = (element_type *)
                local_a0.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if ((double)peVar11 == INFINITY) {
      poVar6 = (ostream *)0x1;
      if ((int)((ulong)((long)(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).open_.data_.
                              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->
                             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                             ).open_.data_.
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[AMHAStar::improvePath] Open list is empty! Error... ",
                   0x35);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        poVar6 = (ostream *)0x0;
      }
      break;
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    lVar7 = lVar7 - (this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.start_time_.__d.__r;
    dVar10 = (double)lVar7 / 1000000000.0;
    pdVar1 = &(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.time_limit_;
    poVar6 = (ostream *)CONCAT71((int7)((ulong)poVar6 >> 8),dVar10 < *pdVar1 || dVar10 == *pdVar1);
    if ((NAN(dVar10) || NAN(*pdVar1)) || (dVar10 < *pdVar1 || dVar10 == *pdVar1)) {
      bVar5 = true;
      if ((this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.num_inad_ < 1) {
        poVar6 = (ostream *)(CONCAT71((int7)((ulong)lVar7 >> 8),local_a1) & 0xffffffff);
      }
      else {
        local_7c = (uint)poVar6;
        lVar7 = 0;
        lVar9 = 0;
        do {
          pHVar4 = (this->open_inad_).
                   super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)(*(long *)((long)&(pHVar4->data_).
                                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish + lVar7) -
                           *(long *)((long)&(pHVar4->data_).
                                            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar7)) >> 4
                   ) < 1) {
            bVar5 = false;
          }
          else {
            csbpl_common::Heap<double>::top(&local_50);
            local_a0.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((local_50.data_.
                            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr;
            local_88 = (element_type *)
                       (this->
                       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                       ).params_.mha_eps_;
            csbpl_common::Heap<double>::top
                      ((Heap<double> *)
                       &local_50.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar5 = (double)local_a0.data_.
                            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage <=
                    (double)local_88 *
                    (double)((local_50.data_.
                              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr;
            if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_50.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_50.data_.
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          if (bVar5) {
            local_a0.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((this->
                           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                           ).goal_vertex_.
                           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->g_cost_;
            csbpl_common::Heap<double>::top(&local_a0);
            peVar11 = ((local_a0.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_a0.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_88 = peVar11;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a0.data_.
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              peVar11 = local_88;
            }
            if ((double)local_a0.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage < (double)peVar11) {
LAB_00104b3b:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "[AMHAStar::improvePath] Goal node expanded. Premature termiation!",0x41);
              poVar6 = (ostream *)(ulong)local_7c;
              goto LAB_00104b5a;
            }
            csbpl_common::Heap<double>::top(&local_70);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_70.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)
                 ((long)local_70.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 8) =
                     *(_Atomic_word *)
                      ((long)local_70.data_.
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)
                 ((long)local_70.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 8) =
                     *(_Atomic_word *)
                      ((long)local_70.data_.
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
              }
            }
            local_a0.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)local_70.data_.
                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
            local_a0.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)local_70.data_.
                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_a0.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_a0.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_a0.data_.
                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_a0.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_a0.data_.
                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_70.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_70.data_.
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_70.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_70.data_.
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            (*(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              )._vptr_Dijkstra[3])(this,&local_a0);
            pmVar8 = std::__detail::
                     _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)local_70.data_.
                                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (key_type *)
                                  (local_a0.data_.
                                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          else {
            local_a0.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((this->
                           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                           ).goal_vertex_.
                           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->g_cost_;
            csbpl_common::Heap<double>::top(&local_a0);
            peVar11 = ((local_a0.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_a0.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_88 = peVar11;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a0.data_.
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              peVar11 = local_88;
            }
            if ((double)local_a0.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage < (double)peVar11)
            goto LAB_00104b3b;
            csbpl_common::Heap<double>::top(&local_70);
            local_a0.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_70.data_.
                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_a0.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_70.data_.
                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_70.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)
                 ((long)local_70.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 8) =
                     *(_Atomic_word *)
                      ((long)local_70.data_.
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)
                 ((long)local_70.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 8) =
                     *(_Atomic_word *)
                      ((long)local_70.data_.
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_70.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_70.data_.
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            (*(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              )._vptr_Dijkstra[3])(this,&local_a0);
            pmVar8 = std::__detail::
                     _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](local_58,(key_type *)
                                           (local_a0.data_.
                                            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          *pmVar8 = true;
          piVar2 = (this->anytime_stats_).num_expansions_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish + -1;
          *piVar2 = *piVar2 + 1;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_a0.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_a0.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          lVar9 = lVar9 + 1;
          iVar3 = (this->
                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ).params_.num_inad_;
          lVar7 = lVar7 + 0x18;
        } while (lVar9 < iVar3);
        poVar6 = (ostream *)(CONCAT71((int7)(int3)((uint)iVar3 >> 8),local_a1) & 0xffffffff);
        bVar5 = true;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[AMHAStar::improvePath] Time limit exceeded... Exiting!",
                 0x37);
LAB_00104b5a:
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      bVar5 = false;
    }
    local_a1 = SUB81(poVar6,0);
  } while (bVar5);
  return (bool)((byte)poVar6 & 1);
}

Assistant:

virtual bool improvePath()
    {
#if DEBUG
      int num_expansions = 0;
  double nearest_node_to_goal_dist = std::numeric_limits<double>::infinity();
  SearchVertexPtr nearest_node_to_goal;
#endif
      this->anytime_stats_.num_expansions_.push_back(0);
      std::cout << "[AMHAStar::improvePath] Improve path iteration: "
                << this->anytime_stats_.num_expansions_.size() << std::endl;
      while (this->open_.top()->key_ < std::numeric_limits<double>::infinity())
      {
        
        double time_elapsed =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        
        if (time_elapsed > this->params_.time_limit_)
        {
          std::cout << "[AMHAStar::improvePath] Time limit exceeded..."
                       " Exiting!" << std::endl;
          return false;
        }
        
        for (int i=0; i<this->params_.num_inad_; ++i)
        {
          if (open_inad_[i].size() > 0 &&
              open_inad_[i].top()->key_ <= this->params_.mha_eps_*this->open_.top()->key_)
          {
            if (this->goal_vertex_->g_cost_ < open_inad_[i].top()->key_)
            {
              std::cout << "[AMHAStar::improvePath] Goal node expanded. "
                           "Premature termiation!" << std::endl;
              return true;
            }
            else
            {
              SearchVertexPtr least_cost_vertex =
                std::static_pointer_cast<SearchVertex>(open_inad_[i].top())->self_ptr_;
              expand(least_cost_vertex);
              closed_inad_[least_cost_vertex->state_] = true;
              ++this->anytime_stats_.num_expansions_.back();
#if DEBUG
              ++num_expansions;
#endif
            }
          }
          else
          {
            if (this->goal_vertex_->g_cost_ < this->open_.top()->key_)
            {
              std::cout << "[AMHAStar::improvePath] Goal node expanded. "
                           "Premature termiation!" << std::endl;
              return true;
            }
            else
            {
              SearchVertexPtr least_cost_vertex =
                std::static_pointer_cast<SearchVertex>(this->open_.top());
              expand(least_cost_vertex);
              this->closed_[least_cost_vertex->state_] = true;
              ++this->anytime_stats_.num_expansions_.back();
#if DEBUG
              ++num_expansions;
#endif
            }
          }
        }
      }

#if DEBUG
      std::cout << "[AMHAStar::improvePath] Total number of expansions: "
                << num_expansions << std::endl;
#endif
      
      
      if (this->open_.size() == 0)
      {
#if DEBUG
        std::cout << "[AMHAStar::improvePath] Open list is empty! Error... "
                     "Returning nearest node reached" << std::endl;
        this->env_ptr_->goal_ = nearest_node_to_goal->state_;
        return true;
#endif
        std::cout << "[AMHAStar::improvePath] Open list is empty! Error... " << std::endl;
        return false;
      }
      
      return true;
    }